

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

long CVariableInt::Compress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/compression.cpp"
                 ,0x54,(uint)((SrcSize & 3U) == 0),"invalid bounds");
  pbVar2 = (byte *)pDst_;
  if (3 < (uint)SrcSize) {
    iVar4 = SrcSize >> 2;
    do {
      if ((long)pDst_ + ((long)DstSize - (long)pbVar2) < 6) {
        return -1;
      }
      uVar6 = *pSrc_;
      uVar3 = (int)uVar6 >> 0x1f ^ uVar6;
      bVar5 = (byte)uVar3 & 0x3f | (byte)(uVar6 >> 0x19) & 0x40;
      *pbVar2 = bVar5;
      if (0x3f < uVar3) {
        uVar6 = uVar3 >> 6;
        do {
          *pbVar2 = bVar5 | 0x80;
          bVar5 = (byte)uVar6 & 0x7f;
          pbVar2[1] = bVar5;
          pbVar2 = pbVar2 + 1;
          bVar1 = 0x7f < uVar6;
          uVar6 = uVar6 >> 7;
        } while (bVar1);
      }
      pbVar2 = pbVar2 + 1;
      pSrc_ = (void *)((long)pSrc_ + 4);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return (long)pbVar2 - (long)pDst_;
}

Assistant:

long CVariableInt::Compress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(SrcSize % sizeof(int) == 0, "invalid bounds");

	const int *pSrc = (int *)pSrc_;
	unsigned char *pDst = (unsigned char *)pDst_;
	const unsigned char *pDstEnd = pDst + DstSize;
	SrcSize /= sizeof(int);
	while(SrcSize)
	{
		if(pDstEnd - pDst <= MAX_BYTES_PACKED)
			return -1;
		pDst = CVariableInt::Pack(pDst, *pSrc);
		SrcSize--;
		pSrc++;
	}
	return (long)(pDst - (unsigned char *)pDst_);
}